

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffcphd(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  char *pcVar3;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  char *unaff_retaddr;
  char *tmpbuff;
  char comm [73];
  char *card;
  long naxes [1];
  long naxis;
  int outPrim;
  int inPrim;
  int ii;
  int nkeys;
  int *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  long *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  int *exttype;
  int iVar4;
  int hdunum;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  hdunum = 0;
  iVar4 = 0;
  if (*in_RDX < 1) {
    if (in_RDI == in_RSI) {
      *in_RDX = 0x65;
      iVar4 = 0x65;
    }
    else {
      if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        ffmahd((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0,
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      }
      iVar1 = ffghsp(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     (int *)0x133554);
      if (iVar1 < 1) {
        __ptr = malloc((long)(in_stack_ffffffffffffffdc * 0x51));
        if (__ptr == (void *)0x0) {
          *in_RDX = 0x71;
          iVar4 = 0x71;
        }
        else {
          for (iVar1 = 0; iVar1 < in_stack_ffffffffffffffdc; iVar1 = iVar1 + 1) {
            ffgrec(in_stack_ffffffffffffff68,(int)((ulong)__ptr >> 0x20),
                   (char *)in_stack_ffffffffffffff58,(int *)0x1335fa);
          }
          if (*in_RDI == 0) {
            hdunum = 1;
          }
          exttype = (int *)0xffffffffffffffff;
          if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
            ffgkyj(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          }
          if (*in_RSI != *(int *)(*(long *)(in_RSI + 2) + 0x54)) {
            ffmahd((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),hdunum,exttype,
                   in_stack_ffffffffffffffc0);
          }
          if (*(long *)(*(long *)(in_RSI + 2) + 0x70) !=
              *(long *)(*(long *)(*(long *)(in_RSI + 2) + 0x68) +
                       (long)*(int *)(*(long *)(in_RSI + 2) + 0x54) * 8)) {
            ffcrhd(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
          }
          if (*in_RSI == 0) {
            if ((long)exttype < 0) {
              ffcrim(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                     (long *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
              ffcrhd(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
            }
            else {
              iVar4 = 1;
            }
          }
          if (*in_RDX < 1) {
            if ((hdunum == 1) && (iVar4 == 0)) {
              strcpy(&stack0xffffffffffffff68,"IMAGE extension");
              ffpkys((fitsfile *)comm._8_8_,(char *)comm._0_8_,
                     (char *)CONCAT44(tmpbuff._4_4_,tmpbuff._0_4_),unaff_retaddr,
                     (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
              for (iVar1 = 1; (long)iVar1 < (long)exttype + 3; iVar1 = iVar1 + 1) {
                ffprec((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),
                       (char *)CONCAT44(hdunum,iVar4),exttype);
              }
              strcpy(&stack0xffffffffffffff68,"number of random group parameters");
              ffpkyj((fitsfile *)comm._8_8_,(char *)comm._0_8_,CONCAT44(tmpbuff._4_4_,tmpbuff._0_4_)
                     ,unaff_retaddr,
                     (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
              strcpy(&stack0xffffffffffffff68,"number of random groups");
              ffpkyj((fitsfile *)comm._8_8_,(char *)comm._0_8_,CONCAT44(tmpbuff._4_4_,tmpbuff._0_4_)
                     ,unaff_retaddr,
                     (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
              for (iVar1 = (int)exttype + 3; iVar1 < in_stack_ffffffffffffffdc; iVar1 = iVar1 + 1) {
                pcVar3 = (char *)((long)__ptr + (long)(iVar1 * 0x51));
                if (((((*pcVar3 < 'E') || ('E' < *pcVar3)) ||
                     (iVar2 = strncmp(pcVar3,"EXTEND  ",8), iVar2 != 0)) &&
                    (((*pcVar3 < 'C' || ('C' < *pcVar3)) ||
                     (iVar2 = strncmp(pcVar3,
                                      "COMMENT   FITS (Flexible Image Transport System) format is",
                                      0x3a), iVar2 != 0)))) &&
                   (((*pcVar3 < 'C' || ('C' < *pcVar3)) ||
                    (iVar2 = strncmp(pcVar3,"COMMENT   and Astrophysics\', volume 376, page 3",0x2f)
                    , iVar2 != 0)))) {
                  ffprec((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),
                         (char *)CONCAT44(hdunum,iVar4),exttype);
                }
              }
            }
            else if ((hdunum == 0) && (iVar4 == 1)) {
              strcpy(&stack0xffffffffffffff68,"file does conform to FITS standard");
              ffpkyl((fitsfile *)comm._8_8_,(char *)comm._0_8_,tmpbuff._4_4_,unaff_retaddr,
                     (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
              for (iVar1 = 1; (long)iVar1 < (long)exttype + 3; iVar1 = iVar1 + 1) {
                ffprec((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),
                       (char *)CONCAT44(hdunum,iVar4),exttype);
              }
              strcpy(&stack0xffffffffffffff68,"FITS dataset may contain extensions");
              ffpkyl((fitsfile *)comm._8_8_,(char *)comm._0_8_,tmpbuff._4_4_,unaff_retaddr,
                     (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
              ffprec((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),
                     (char *)CONCAT44(hdunum,iVar4),exttype);
              ffprec((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),
                     (char *)CONCAT44(hdunum,iVar4),exttype);
              for (iVar1 = (int)exttype + 3; iVar1 < in_stack_ffffffffffffffdc; iVar1 = iVar1 + 1) {
                pcVar3 = (char *)((long)__ptr + (long)(iVar1 * 0x51));
                if ((((*pcVar3 < 'P') || ('P' < *pcVar3)) ||
                    (iVar2 = strncmp(pcVar3,"PCOUNT  ",8), iVar2 != 0)) &&
                   (((*pcVar3 < 'G' || ('G' < *pcVar3)) ||
                    (iVar2 = strncmp(pcVar3,"GCOUNT  ",8), iVar2 != 0)))) {
                  ffprec((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),
                         (char *)CONCAT44(hdunum,iVar4),exttype);
                }
              }
            }
            else {
              for (iVar1 = 0; iVar1 < in_stack_ffffffffffffffdc; iVar1 = iVar1 + 1) {
                ffprec((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),
                       (char *)CONCAT44(hdunum,iVar4),exttype);
              }
            }
            free(__ptr);
            iVar4 = *in_RDX;
          }
          else {
            free(__ptr);
            iVar4 = *in_RDX;
          }
        }
      }
      else {
        iVar4 = *in_RDX;
      }
    }
  }
  else {
    iVar4 = *in_RDX;
  }
  return iVar4;
}

Assistant:

int ffcphd(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int *status)         /* IO - error status     */
/*
  copy the header keywords from infptr to outfptr.
*/
{
    int nkeys, ii, inPrim = 0, outPrim = 0;
    long naxis, naxes[1];
    char *card, comm[FLEN_COMMENT];
    char *tmpbuff;

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    /* set the input pointer to the correct HDU */
    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);

    if (ffghsp(infptr, &nkeys, NULL, status) > 0) /* get no. of keywords */
        return(*status);

    /* create a memory buffer to hold the header records */
    tmpbuff = (char*) malloc(nkeys*FLEN_CARD*sizeof(char));
    if (!tmpbuff)
        return(*status = MEMORY_ALLOCATION);

    /* read all of the header records in the input HDU */
    for (ii = 0; ii < nkeys; ii++)
      ffgrec(infptr, ii+1, tmpbuff + (ii * FLEN_CARD), status);

    if (infptr->HDUposition == 0)  /* set flag if this is the Primary HDU */
       inPrim = 1;

    /* if input is an image hdu, get the number of axes */
    naxis = -1;   /* negative if HDU is a table */
    if ((infptr->Fptr)->hdutype == IMAGE_HDU)
        ffgkyj(infptr, "NAXIS", &naxis, NULL, status);

    /* set the output pointer to the correct HDU */
    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);

    /* check if output header is empty; if not create new empty HDU */
    if ((outfptr->Fptr)->headend !=
        (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu] )
           ffcrhd(outfptr, status);   

    if (outfptr->HDUposition == 0)
    {
        if (naxis < 0)
        {
            /* the input HDU is a table, so we have to create */
            /* a dummy Primary array before copying it to the output */
            ffcrim(outfptr, 8, 0, naxes, status);
            ffcrhd(outfptr, status); /* create new empty HDU */
        }
        else
        {
            /* set flag that this is the Primary HDU */
            outPrim = 1;
        }
    }

    if (*status > 0)  /* check for errors before proceeding */
    {
        free(tmpbuff);
        return(*status);
    }
    if ( inPrim == 1 && outPrim == 0 )
    {
        /* copying from primary array to image extension */
        strcpy(comm, "IMAGE extension");
        ffpkys(outfptr, "XTENSION", "IMAGE", comm, status);

        /* copy BITPIX through NAXISn keywords */
        for (ii = 1; ii < 3 + naxis; ii++)
        {
            card = tmpbuff + (ii * FLEN_CARD);
            ffprec(outfptr, card, status);
        }

        strcpy(comm, "number of random group parameters");
        ffpkyj(outfptr, "PCOUNT", 0, comm, status);
  
        strcpy(comm, "number of random groups");
        ffpkyj(outfptr, "GCOUNT", 1, comm, status);


        /* copy remaining keywords, excluding EXTEND, and reference COMMENT keywords */
        for (ii = 3 + naxis ; ii < nkeys; ii++)
        {
            card = tmpbuff+(ii * FLEN_CARD);
            if (FSTRNCMP(card, "EXTEND  ", 8) &&
                FSTRNCMP(card, "COMMENT   FITS (Flexible Image Transport System) format is", 58) && 
                FSTRNCMP(card, "COMMENT   and Astrophysics', volume 376, page 3", 47) )
            {
                 ffprec(outfptr, card, status);
            }
        }
    }
    else if ( inPrim == 0 && outPrim == 1 )
    {
        /* copying between image extension and primary array */
        strcpy(comm, "file does conform to FITS standard");
        ffpkyl(outfptr, "SIMPLE", TRUE, comm, status);

        /* copy BITPIX through NAXISn keywords */
        for (ii = 1; ii < 3 + naxis; ii++)
        {
            card = tmpbuff + (ii * FLEN_CARD);
            ffprec(outfptr, card, status);
        }

        /* add the EXTEND keyword */
        strcpy(comm, "FITS dataset may contain extensions");
        ffpkyl(outfptr, "EXTEND", TRUE, comm, status);

      /* write standard block of self-documentating comments */
      ffprec(outfptr,
      "COMMENT   FITS (Flexible Image Transport System) format is defined in 'Astronomy",
      status);
      ffprec(outfptr,
      "COMMENT   and Astrophysics', volume 376, page 359; bibcode: 2001A&A...376..359H",
      status);

        /* copy remaining keywords, excluding pcount, gcount */
        for (ii = 3 + naxis; ii < nkeys; ii++)
        {
            card = tmpbuff+(ii * FLEN_CARD);
            if (FSTRNCMP(card, "PCOUNT  ", 8) && FSTRNCMP(card, "GCOUNT  ", 8))
            {
                 ffprec(outfptr, card, status);
            }
        }
    }
    else
    {
        /* input and output HDUs are same type; simply copy all keywords */
        for (ii = 0; ii < nkeys; ii++)
        {
            card = tmpbuff+(ii * FLEN_CARD);
            ffprec(outfptr, card, status);
        }
    }

    free(tmpbuff);
    return(*status);
}